

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xml.cpp
# Opt level: O1

bool __thiscall Xml::Parser::load(Parser *this,String *filePath,Element *element)

{
  usize *puVar1;
  Private *this_00;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *data_00;
  File file;
  String data;
  File FStack_78;
  String local_70;
  String local_48;
  
  File::File(&FStack_78);
  iVar3 = File::open(&FStack_78,(char *)filePath,1);
  if ((char)iVar3 == '\0') {
    uVar4 = Error::getLastError();
    Error::getErrorString(&local_70,uVar4);
    String::operator=(&(this->p->super_Private).errorString,&local_70);
    if ((local_70.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_70.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_70.data != (Data *)0x0)) {
        operator_delete__(local_70.data);
      }
    }
    bVar2 = false;
  }
  else {
    local_70.data = &String::emptyData.super_Data;
    bVar2 = File::readAll(&FStack_78,&local_70);
    if (bVar2) {
      this_00 = &this->p->super_Private;
      data_00 = String::operator_cast_to_char_(&local_70);
      bVar2 = Private::parse(this_00,data_00,element);
    }
    else {
      uVar4 = Error::getLastError();
      Error::getErrorString(&local_48,uVar4);
      String::operator=(&(this->p->super_Private).errorString,&local_48);
      if ((local_48.data)->ref != 0) {
        LOCK();
        puVar1 = &(local_48.data)->ref;
        *puVar1 = *puVar1 - 1;
        UNLOCK();
        if ((*puVar1 == 0) && (local_48.data != (Data *)0x0)) {
          operator_delete__(local_48.data);
        }
      }
      bVar2 = false;
    }
    if ((local_70.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_70.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_70.data != (Data *)0x0)) {
        operator_delete__(local_70.data);
      }
    }
  }
  File::~File(&FStack_78);
  return bVar2;
}

Assistant:

bool Xml::Parser::load(const String& filePath, Element& element)
{
  File file;
  if(!file.open(filePath))
    return p->errorString = Error::getErrorString(), false;
  String data;
  if(!file.readAll(data))
    return p->errorString = Error::getErrorString(), false;
  return p->parse(data, element);
}